

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

void __thiscall
sc_core::sc_trace_file_base::sc_trace_file_base(sc_trace_file_base *this,char *name,char *extension)

{
  ostream *poVar1;
  sc_object *this_00;
  char *in_RDX;
  char *in_RSI;
  sc_trace_file *in_RDI;
  stringstream ss;
  phase_cb_mask in_stack_fffffffffffffdfc;
  undefined8 in_stack_fffffffffffffe10;
  undefined1 preserve_first;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [20];
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  sc_severity in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffea8;
  sc_object *in_stack_fffffffffffffeb0;
  
  preserve_first = (undefined1)((ulong)in_stack_fffffffffffffe10 >> 0x38);
  sc_trace_file::sc_trace_file(in_RDI);
  sc_gen_unique_name((char *)in_RDI,(bool)preserve_first);
  sc_object::sc_object(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  in_RDI->_vptr_sc_trace_file = (_func_int **)&PTR___cxa_pure_virtual_00365518;
  in_RDI[1]._vptr_sc_trace_file = (_func_int **)&PTR_print_00365650;
  in_RDI[0xf]._vptr_sc_trace_file = (_func_int **)0x0;
  in_RDI[0x10]._vptr_sc_trace_file = (_func_int **)0x0;
  in_RDI[0x11]._vptr_sc_trace_file = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0x12]._vptr_sc_trace_file = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x13));
  *(undefined1 *)&in_RDI[0x17]._vptr_sc_trace_file = 0;
  *(undefined1 *)((long)&in_RDI[0x17]._vptr_sc_trace_file + 1) = 0;
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    sc_report_handler::report
              (in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,in_RSI);
    this_00 = (sc_object *)std::operator<<(poVar1,".");
    std::operator<<((ostream *)this_00,in_RDX);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::swap(local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    sc_object::detach(this_00);
    sc_object::register_simulation_phase_callback(this_00,in_stack_fffffffffffffdfc);
  }
  return;
}

Assistant:

sc_trace_file_base::sc_trace_file_base( const char* name, const char* extension )
  : sc_trace_file()
#if SC_TRACING_PHASE_CALLBACKS_
  , sc_object( sc_gen_unique_name("$$$$kernel_tracefile$$$$") )
#endif
  , fp(0)
  , trace_unit_fs()
  , kernel_unit_fs()
  , timescale_set_by_user(false)
  , filename_()
  , initialized_(false)
  , trace_delta_cycles_(false)
{
    if( !name || !*name ) {
        SC_REPORT_ERROR( SC_ID_TRACING_FOPEN_FAILED_, "no name given" );
        return;
    } else {
        std::stringstream ss;
        ss << name << "." << extension;
        ss.str().swap( filename_ );
    }

#if SC_TRACING_PHASE_CALLBACKS_ == 1
    // remove from hierarchy
    sc_object::detach();
    // register regular (non-delta) callbacks
    sc_object::register_simulation_phase_callback( SC_BEFORE_TIMESTEP );
#else // explicitly register with simcontext
    sc_get_curr_simcontext()->add_trace_file( this );
#endif
}